

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::SetSourcefv
               (ALsource *Source,ALCcontext *Context,SourceProp prop,
               span<const_float,_18446744073709551615UL> values)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  index_type iVar4;
  reference pfVar5;
  uint in_EDX;
  ALCcontext *in_RSI;
  VoicePos *in_RDI;
  bool bVar6;
  optional<(anonymous_namespace)::VoicePos> vpos;
  Voice *voice;
  int ival;
  SourceProp in_stack_0000034c;
  ALCcontext *in_stack_00000350;
  ALsource *in_stack_00000358;
  span<const_int,_18446744073709551615UL> in_stack_00000360;
  size_type in_stack_fffffffffffffd18;
  optional<(anonymous_namespace)::VoicePos> *in_stack_fffffffffffffd20;
  ALCcontext *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  ALCcontext *in_stack_fffffffffffffd48;
  ALsource *in_stack_fffffffffffffd50;
  bool local_271;
  bool local_251;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  ALenum in_stack_fffffffffffffdc4;
  float fVar7;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  bool local_211;
  bool local_1f1;
  undefined4 in_stack_fffffffffffffe18;
  undefined2 in_stack_fffffffffffffe1c;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  ALCcontext *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  VoicePos *vpos_00;
  span<const_int,_18446744073709551615UL> local_98;
  span<const_int,_18446744073709551615UL> local_88;
  int local_78;
  optional<(anonymous_namespace)::VoicePos> local_50;
  Voice *local_38;
  int local_30;
  uint local_2c;
  ALCcontext *local_28;
  VoicePos *local_20;
  span<const_float,_18446744073709551615UL> local_18;
  byte local_1;
  
  local_2c = in_EDX;
  local_28 = in_RSI;
  if (in_EDX == 0x202) goto LAB_001605a7;
  local_20 = in_RDI;
  if (in_EDX == 0x1001) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = false;
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        bVar6 = *pfVar5 <= 360.0;
      }
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20[1].frac = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1002) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = false;
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        bVar6 = *pfVar5 <= 360.0;
      }
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        *(float *)&local_20[1].bufferitem = *pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1003) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20->pos = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1004) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 3) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = std::isfinite(*pfVar5);
      local_211 = false;
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        bVar6 = std::isfinite(*pfVar5);
        local_211 = false;
        if (bVar6) {
          pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
          local_211 = std::isfinite(*pfVar5);
        }
      }
      if (local_211 == false) {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
      else {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1005) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 3) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = std::isfinite(*pfVar5);
      local_251 = false;
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        bVar6 = std::isfinite(*pfVar5);
        local_251 = false;
        if (bVar6) {
          pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
          local_251 = std::isfinite(*pfVar5);
        }
      }
      if (local_251 == false) {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
      else {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1006) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 3) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = std::isfinite(*pfVar5);
      bVar1 = false;
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        bVar6 = std::isfinite(*pfVar5);
        bVar1 = false;
        if (bVar6) {
          pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
          bVar1 = std::isfinite(*pfVar5);
        }
      }
      if (bVar1 == false) {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
      else {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1007) goto LAB_001605a7;
  if (in_EDX == 0x1009) goto LAB_001607f9;
  if (in_EDX == 0x100a) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20->frac = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x100d) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        *(float *)((long)&local_20->bufferitem + 4) = *pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x100e) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20[1].pos = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x100f) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 6) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = std::isfinite(*pfVar5);
      local_271 = false;
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        bVar6 = std::isfinite(*pfVar5);
        local_271 = false;
        if (bVar6) {
          pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
          bVar6 = std::isfinite(*pfVar5);
          local_271 = false;
          if (bVar6) {
            pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,3);
            bVar6 = std::isfinite(*pfVar5);
            local_271 = false;
            if (bVar6) {
              pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,4);
              bVar6 = std::isfinite(*pfVar5);
              local_271 = false;
              if (bVar6) {
                pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,5);
                local_271 = std::isfinite(*pfVar5);
              }
            }
          }
        }
      }
      if (local_271 == false) {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
      else {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,2);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,3);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,4);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,5);
        fVar7 = *pfVar5;
        pvVar3 = std::array<float,_3UL>::operator[]
                           ((array<float,_3UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar3 = fVar7;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,6,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1010) goto LAB_001605a7;
  if (in_EDX - 0x1015 < 2) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      local_30 = (int)(long)*pfVar5;
      al::span<const_int,_18446744073709551615UL>::span(&local_98,&local_30,1);
      local_1 = SetSourceiv(in_stack_00000358,in_stack_00000350,in_stack_0000034c,in_stack_00000360)
      ;
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1020) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        *(float *)((long)&local_20[1].bufferitem + 4) = *pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1021) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20[2].frac = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1022) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = false;
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        bVar6 = *pfVar5 <= 1.0;
      }
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        *(float *)&local_20->bufferitem = *pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1023) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20[2].pos = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX - 0x1024 < 3) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      if (0.0 <= *pfVar5) {
        local_38 = GetSourceVoice(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
        if (local_38 != (Voice *)0x0) {
          if ((local_38->mFlags & 2) != 0) {
            ALCcontext::setError(local_28,0xa003,"Source offset for callback is invalid");
            local_1 = 0;
            goto LAB_0016085b;
          }
          al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
          GetSampleOffset((BufferlistItem *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                          in_stack_fffffffffffffdc4,
                          (double)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
          al::optional<(anonymous_namespace)::VoicePos>::optional<true,_true>
                    ((optional<(anonymous_namespace)::VoicePos> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     (optional<(anonymous_namespace)::VoicePos> *)in_stack_fffffffffffffd28);
          al::optional<(anonymous_namespace)::VoicePos>::~optional(in_stack_fffffffffffffd20);
          bVar6 = al::optional::operator_cast_to_bool((optional *)&local_50);
          if (bVar6) {
            al::optional<(anonymous_namespace)::VoicePos>::operator*(&local_50);
            vpos_00 = local_20;
            al::intrusive_ptr<ALCdevice>::get(&local_28->mDevice);
            bVar6 = SetVoiceOffset((Voice *)local_28,vpos_00,
                                   (ALsource *)
                                   CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                   in_stack_fffffffffffffe20,
                                   (ALCdevice *)
                                   CONCAT17(in_stack_fffffffffffffe1f,
                                            CONCAT16(in_stack_fffffffffffffe1e,
                                                     CONCAT24(in_stack_fffffffffffffe1c,
                                                              in_stack_fffffffffffffe18))));
            if (bVar6) {
              local_1 = 1;
              local_78 = 1;
            }
            else {
              local_78 = 0;
            }
          }
          else {
            ALCcontext::setError(local_28,0xa003,"Invalid offset");
            local_1 = 0;
            local_78 = 1;
          }
          al::optional<(anonymous_namespace)::VoicePos>::~optional(in_stack_fffffffffffffd20);
          if (local_78 != 0) goto LAB_0016085b;
        }
        local_20[0x17].pos = local_2c;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20[0x16].bufferitem = (BufferlistItem *)(double)*pfVar5;
        local_1 = 1;
      }
      else {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1027) {
LAB_001605a7:
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      local_30 = (int)*pfVar5;
      al::span<const_int,_18446744073709551615UL>::span(&local_88,&local_30,1);
      local_1 = SetSourceiv(in_stack_00000358,in_stack_00000350,in_stack_0000034c,in_stack_00000360)
      ;
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1030) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 2) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = std::isfinite(*pfVar5);
      local_1f1 = false;
      if (bVar6) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        local_1f1 = std::isfinite(*pfVar5);
      }
      if (local_1f1 == false) {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
      else {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        fVar7 = *pfVar5;
        pvVar2 = std::array<float,_2UL>::operator[]
                           ((array<float,_2UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar2 = fVar7;
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,1);
        fVar7 = *pfVar5;
        pvVar2 = std::array<float,_2UL>::operator[]
                           ((array<float,_2UL> *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18
                           );
        *pvVar2 = fVar7;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,2,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1031) {
    iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
    bVar6 = true;
    if (iVar4 != 1) {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      bVar6 = iVar4 == 6;
    }
    if (bVar6) {
      pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
      bVar6 = false;
      if (0.0 <= *pfVar5) {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        bVar6 = std::isfinite(*pfVar5);
      }
      if (bVar6 == false) {
        ALCcontext::setError(local_28,0xa003,"Value out of range");
        local_1 = 0;
      }
      else {
        pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
        local_20[9].pos = (ALuint)*pfVar5;
        local_1 = UpdateSourceProps((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                    in_stack_fffffffffffffd28);
      }
    }
    else {
      iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar4);
      local_1 = 0;
    }
    goto LAB_0016085b;
  }
  if (in_EDX == 0x1033) goto LAB_001605a7;
  if (in_EDX == 0x1200) {
LAB_001607f9:
    if (0 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",(ulong)in_EDX);
    }
    ALCcontext::setError(local_28,0xa002,"Invalid source float property 0x%04x",(ulong)local_2c);
    local_1 = 0;
  }
  else {
    if (in_EDX != 0x1201) {
      if (in_EDX == 0x1202) goto LAB_001607f9;
      if (in_EDX != 0x1203) {
        if ((in_EDX != 0x1212) && (in_EDX != 0x1214)) {
          if (in_EDX == 0xc000) {
            iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
            bVar6 = true;
            if (iVar4 != 1) {
              iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
              bVar6 = iVar4 == 6;
            }
            if (bVar6) {
              pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
              bVar6 = false;
              if (0.0 <= *pfVar5) {
                pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                bVar6 = *pfVar5 <= 1.0;
              }
              if (bVar6) {
                pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                local_20[8].frac = (ALuint)*pfVar5;
                local_1 = UpdateSourceProps((ALsource *)
                                            CONCAT44(in_stack_fffffffffffffd34,
                                                     in_stack_fffffffffffffd30),
                                            in_stack_fffffffffffffd28);
              }
              else {
                ALCcontext::setError(local_28,0xa003,"Value out of range");
                local_1 = 0;
              }
            }
            else {
              iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
              ALCcontext::setError
                        (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_2c,1,iVar4);
              local_1 = 0;
            }
            goto LAB_0016085b;
          }
          if (in_EDX != 0xd000) {
            if (1 < in_EDX - 0x20005) {
              if (in_EDX == 0x20007) {
                iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                bVar6 = true;
                if (iVar4 != 1) {
                  iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                  bVar6 = iVar4 == 6;
                }
                if (bVar6) {
                  pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                  bVar6 = false;
                  if (0.0 <= *pfVar5) {
                    pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                    bVar6 = *pfVar5 <= 10.0;
                  }
                  if (bVar6) {
                    pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                    *(float *)((long)&local_20[7].bufferitem + 4) = *pfVar5;
                    local_1 = UpdateSourceProps((ALsource *)
                                                CONCAT44(in_stack_fffffffffffffd34,
                                                         in_stack_fffffffffffffd30),
                                                in_stack_fffffffffffffd28);
                  }
                  else {
                    ALCcontext::setError(local_28,0xa003,"Value out of range");
                    local_1 = 0;
                  }
                }
                else {
                  iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                  ALCcontext::setError
                            (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                             (ulong)local_2c,1,iVar4);
                  local_1 = 0;
                }
                goto LAB_0016085b;
              }
              if (in_EDX == 0x20008) {
                iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                bVar6 = true;
                if (iVar4 != 1) {
                  iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                  bVar6 = iVar4 == 6;
                }
                if (bVar6) {
                  pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                  bVar6 = false;
                  if (0.0 <= *pfVar5) {
                    pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                    bVar6 = *pfVar5 <= 10.0;
                  }
                  if (bVar6) {
                    pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                    local_20[8].pos = (ALuint)*pfVar5;
                    local_1 = UpdateSourceProps((ALsource *)
                                                CONCAT44(in_stack_fffffffffffffd34,
                                                         in_stack_fffffffffffffd30),
                                                in_stack_fffffffffffffd28);
                  }
                  else {
                    ALCcontext::setError(local_28,0xa003,"Value out of range");
                    local_1 = 0;
                  }
                }
                else {
                  iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                  ALCcontext::setError
                            (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                             (ulong)local_2c,1,iVar4);
                  local_1 = 0;
                }
                goto LAB_0016085b;
              }
              if (in_EDX == 0x20009) {
                iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                bVar6 = true;
                if (iVar4 != 1) {
                  iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                  bVar6 = iVar4 == 6;
                }
                if (bVar6) {
                  pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                  bVar6 = false;
                  if (0.0 <= *pfVar5) {
                    pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                    bVar6 = *pfVar5 <= 1.0;
                  }
                  if (bVar6) {
                    pfVar5 = al::span<const_float,_18446744073709551615UL>::operator[](&local_18,0);
                    *(float *)&local_20[7].bufferitem = *pfVar5;
                    local_1 = UpdateSourceProps((ALsource *)
                                                CONCAT44(in_stack_fffffffffffffd34,
                                                         in_stack_fffffffffffffd30),
                                                in_stack_fffffffffffffd28);
                  }
                  else {
                    ALCcontext::setError(local_28,0xa003,"Value out of range");
                    local_1 = 0;
                  }
                }
                else {
                  iVar4 = al::span<const_float,_18446744073709551615UL>::size(&local_18);
                  ALCcontext::setError
                            (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                             (ulong)local_2c,1,iVar4);
                  local_1 = 0;
                }
                goto LAB_0016085b;
              }
              if (in_EDX - 0x2000a < 3) goto LAB_001605a7;
            }
            goto LAB_001607f9;
          }
        }
        goto LAB_001605a7;
      }
    }
    ALCcontext::setError(in_RSI,0xa004,"Setting read-only source property 0x%04x",(ulong)in_EDX);
    local_1 = 0;
  }
LAB_0016085b:
  return (bool)(local_1 & 1);
}

Assistant:

bool SetSourcefv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<const float> values)
{
    int ival;

    switch(prop)
    {
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
        /* Query only */
        SETERR_RETURN(Context, AL_INVALID_OPERATION, false,
            "Setting read-only source property 0x%04x", prop);

    case AL_PITCH:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->Pitch = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_INNER_ANGLE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 360.0f);

        Source->InnerAngle = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_ANGLE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 360.0f);

        Source->OuterAngle = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->Gain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MAX_DISTANCE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MaxDistance = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->RolloffFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_REFERENCE_DISTANCE:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->RefDistance = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MIN_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MinGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_MAX_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        Source->MaxGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_GAIN:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->OuterGain = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_CONE_OUTER_GAINHF:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->OuterGainHF = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_AIR_ABSORPTION_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 10.0f);

        Source->AirAbsorptionFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_ROOM_ROLLOFF_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 10.0f);

        Source->RoomRolloffFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_DOPPLER_FACTOR:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && values[0] <= 1.0f);

        Source->DopplerFactor = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f);

        if(Voice *voice{GetSourceVoice(Source, Context)})
        {
            if((voice->mFlags&VoiceIsCallback))
                SETERR_RETURN(Context, AL_INVALID_VALUE, false,
                    "Source offset for callback is invalid");
            auto vpos = GetSampleOffset(Source->queue, prop, values[0]);
            if(!vpos) SETERR_RETURN(Context, AL_INVALID_VALUE, false, "Invalid offset");

            if(SetVoiceOffset(voice, *vpos, Source, Context, Context->mDevice.get()))
                return true;
        }
        Source->OffsetType = prop;
        Source->Offset = values[0];
        return true;

    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        CHECKVAL(values[0] >= 0.0f && std::isfinite(values[0]));

        Source->Radius = values[0];
        return UpdateSourceProps(Source, Context);

    case AL_STEREO_ANGLES:
        CHECKSIZE(values, 2);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]));

        Source->StereoPan[0] = values[0];
        Source->StereoPan[1] = values[1];
        return UpdateSourceProps(Source, Context);


    case AL_POSITION:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Position[0] = values[0];
        Source->Position[1] = values[1];
        Source->Position[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_VELOCITY:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Velocity[0] = values[0];
        Source->Velocity[1] = values[1];
        Source->Velocity[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2]));

        Source->Direction[0] = values[0];
        Source->Direction[1] = values[1];
        Source->Direction[2] = values[2];
        return UpdateSourceProps(Source, Context);

    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        CHECKVAL(std::isfinite(values[0]) && std::isfinite(values[1]) && std::isfinite(values[2])
            && std::isfinite(values[3]) && std::isfinite(values[4]) && std::isfinite(values[5]));

        Source->OrientAt[0] = values[0];
        Source->OrientAt[1] = values[1];
        Source->OrientAt[2] = values[2];
        Source->OrientUp[0] = values[3];
        Source->OrientUp[1] = values[4];
        Source->OrientUp[2] = values[5];
        return UpdateSourceProps(Source, Context);


    case AL_SOURCE_RELATIVE:
    case AL_LOOPING:
    case AL_SOURCE_STATE:
    case AL_SOURCE_TYPE:
    case AL_DISTANCE_MODEL:
    case AL_DIRECT_FILTER_GAINHF_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
    case AL_DIRECT_CHANNELS_SOFT:
    case AL_SOURCE_RESAMPLER_SOFT:
    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        ival = static_cast<int>(values[0]);
        return SetSourceiv(Source, Context, prop, {&ival, 1u});

    case AL_BUFFERS_QUEUED:
    case AL_BUFFERS_PROCESSED:
        CHECKSIZE(values, 1);
        ival = static_cast<int>(static_cast<ALuint>(values[0]));
        return SetSourceiv(Source, Context, prop, {&ival, 1u});

    case AL_BUFFER:
    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break;
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source float property 0x%04x", prop);
    return false;
}